

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ItemSimilarityRecommender::clear_itemint64ids
          (ItemSimilarityRecommender *this)

{
  ulong uVar1;
  Int64Vector *this_00;
  undefined8 *puVar2;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if ((puVar2 == (undefined8 *)0x0) &&
     (this_00 = this->itemint64ids_, this_00 != (Int64Vector *)0x0)) {
    Int64Vector::~Int64Vector(this_00);
    operator_delete(this_00,0x28);
  }
  this->itemint64ids_ = (Int64Vector *)0x0;
  return;
}

Assistant:

void ItemSimilarityRecommender::clear_itemint64ids() {
  if (GetArenaForAllocation() == nullptr && itemint64ids_ != nullptr) {
    delete itemint64ids_;
  }
  itemint64ids_ = nullptr;
}